

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FboCases::SharedColorbufferClearsTest::render
          (SharedColorbufferClearsTest *this,Context *context,Surface *dst)

{
  GLenum reason;
  deUint32 program;
  uint uVar1;
  uint uVar2;
  FboIncompleteException *this_00;
  int fbo;
  ulong uVar3;
  FboConfig *config;
  Vec3 local_1a8;
  Vec3 local_198;
  SingleTex2DShader shader;
  
  checkColorFormatSupport(context,(this->super_FboRenderCase).m_config.colorbufferFormat);
  if ((this->super_FboRenderCase).m_config.colorbufferType == 0xde1) {
    (*context->_vptr_Context[6])(context,0xde1);
    (*context->_vptr_Context[0x7e])
              (context,0xde1,0,(ulong)(this->super_FboRenderCase).m_config.colorbufferFormat,0x80,
               0x80);
    (*context->_vptr_Context[0x1d])(context,0xde1,0x2801,0x2601);
  }
  else {
    (*context->_vptr_Context[0xc])(context,0x8d41,1);
    (*context->_vptr_Context[0x23])
              (context,0x8d41,(ulong)(this->super_FboRenderCase).m_config.colorbufferFormat,0x80,
               0x80);
  }
  config = &(this->super_FboRenderCase).m_config;
  uVar3 = 1;
  while( true ) {
    if ((int)uVar3 == 4) break;
    (*context->_vptr_Context[9])(context,0x8d40,uVar3);
    if (config->colorbufferType == 0xde1) {
      (*context->_vptr_Context[0x1e])();
    }
    else {
      (*context->_vptr_Context[0x20])(context,0x8d40,0x8ce0,0x8d41,1);
    }
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  (*context->_vptr_Context[9])(context,0x8d40,1);
  reason = (*context->_vptr_Context[0x21])(context,0x8d40);
  if (reason == 0x8cd5) {
    (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
    (*context->_vptr_Context[0x2a])(0,0,0x3f800000,0x3f800000,context);
    (*context->_vptr_Context[0x2d])(context,0x4000);
    (*context->_vptr_Context[0x33])(context,0xc11);
    (*context->_vptr_Context[9])(context,0x8d40,2);
    (*context->_vptr_Context[0x2a])(0x3f19999a,0,0,0x3f800000,context);
    (*context->_vptr_Context[0x32])(context,10,10,0x40,0x40);
    (*context->_vptr_Context[0x2d])(context,0x4000);
    (*context->_vptr_Context[0x2a])(0,0x3f19999a,0,0x3f800000,context);
    (*context->_vptr_Context[0x32])(context,0x3c,0x3c,0x28,0x14);
    (*context->_vptr_Context[0x2d])(context,0x4000);
    (*context->_vptr_Context[9])(context,0x8d40,3);
    (*context->_vptr_Context[0x2a])(0,0,0x3f19999a,0x3f800000,context);
    (*context->_vptr_Context[0x32])(context,0x14,0x14,100,10);
    (*context->_vptr_Context[0x2d])(context,0x4000);
    (*context->_vptr_Context[9])(context,0x8d40,1);
    (*context->_vptr_Context[0x2a])(0x3f19999a,0,0x3f19999a,0x3f800000,context);
    (*context->_vptr_Context[0x32])(context,0x14,0x14,5,100);
    (*context->_vptr_Context[0x2d])(context,0x4000);
    (*context->_vptr_Context[0x34])(context,0xc11);
    if (config->colorbufferType == 0xde1) {
      SingleTex2DShader::SingleTex2DShader(&shader);
      program = (*context->_vptr_Context[0x75])(context,&shader);
      SingleTex2DShader::setUnit(&shader,context,program,0);
      (*context->_vptr_Context[9])(context,0x8d40,0);
      uVar1 = (*context->_vptr_Context[2])(context);
      uVar2 = (*context->_vptr_Context[3])(context);
      (*context->_vptr_Context[5])(context,0,0,(ulong)uVar1,(ulong)uVar2);
      local_198.m_data[0] = -0.9;
      local_198.m_data[1] = -0.9;
      local_198.m_data[2] = 0.0;
      local_1a8.m_data._0_8_ = 0x3f6666663f666666;
      local_1a8.m_data[2] = 0.0;
      sglr::drawQuad(context,program,&local_198,&local_1a8);
      uVar1 = (*context->_vptr_Context[2])(context);
      uVar2 = (*context->_vptr_Context[3])(context);
      (*context->_vptr_Context[0x80])(context,dst,0,0,(ulong)uVar1,(ulong)uVar2);
      sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
      return;
    }
    (*context->_vptr_Context[0x80])(context,dst,0,0,0x80,0x80);
    return;
  }
  this_00 = (FboIncompleteException *)__cxa_allocate_exception(0x50);
  FboIncompleteException::FboIncompleteException
            (this_00,config,reason,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fFboRenderTest.cpp"
             ,0x54f);
  __cxa_throw(this_00,&FboIncompleteException::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SharedColorbufferClearsTest::render (sglr::Context& context, Surface& dst)
{
	int			width			= 128;
	int			height			= 128;
	deUint32	colorbuffer		= 1;

	checkColorFormatSupport(context, getConfig().colorbufferFormat);

	// Single colorbuffer
	if (getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		context.bindTexture(GL_TEXTURE_2D, colorbuffer);
		context.texImage2D(GL_TEXTURE_2D, 0, getConfig().colorbufferFormat, width, height);
		context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	}
	else
	{
		DE_ASSERT(getConfig().colorbufferType == GL_RENDERBUFFER);
		context.bindRenderbuffer(GL_RENDERBUFFER, colorbuffer);
		context.renderbufferStorage(GL_RENDERBUFFER, getConfig().colorbufferFormat, width, height);
	}

	// Multiple framebuffers sharing the colorbuffer
	for (int fbo = 1; fbo <= 3; fbo++)
	{
		context.bindFramebuffer(GL_FRAMEBUFFER, fbo);

		if (getConfig().colorbufferType == GL_TEXTURE_2D)
			context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, colorbuffer, 0);
		else
			context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorbuffer);
	}

	context.bindFramebuffer(GL_FRAMEBUFFER, 1);

	// Check completeness
	{
		GLenum status = context.checkFramebufferStatus(GL_FRAMEBUFFER);
		if (status != GL_FRAMEBUFFER_COMPLETE)
			throw FboIncompleteException(getConfig(), status, __FILE__, __LINE__);
	}

	// Render to them
	context.viewport(0, 0, width, height);
	context.clearColor(0.0f, 0.0f, 1.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT);

	context.enable(GL_SCISSOR_TEST);

	context.bindFramebuffer(GL_FRAMEBUFFER, 2);
	context.clearColor(0.6f, 0.0f, 0.0f, 1.0f);
	context.scissor(10, 10, 64, 64);
	context.clear(GL_COLOR_BUFFER_BIT);
	context.clearColor(0.0f, 0.6f, 0.0f, 1.0f);
	context.scissor(60, 60, 40, 20);
	context.clear(GL_COLOR_BUFFER_BIT);

	context.bindFramebuffer(GL_FRAMEBUFFER, 3);
	context.clearColor(0.0f, 0.0f, 0.6f, 1.0f);
	context.scissor(20, 20, 100, 10);
	context.clear(GL_COLOR_BUFFER_BIT);

	context.bindFramebuffer(GL_FRAMEBUFFER, 1);
	context.clearColor(0.6f, 0.0f, 0.6f, 1.0f);
	context.scissor(20, 20, 5, 100);
	context.clear(GL_COLOR_BUFFER_BIT);

	context.disable(GL_SCISSOR_TEST);

	if (getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		SingleTex2DShader	shader;
		deUint32			shaderID = context.createProgram(&shader);

		shader.setUnit(context, shaderID, 0);

		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		sglr::drawQuad(context, shaderID, Vec3(-0.9f, -0.9f, 0.0f), Vec3(0.9f, 0.9f, 0.0f));
		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
		context.readPixels(dst, 0, 0, width, height);
}